

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# membrane.c++
# Opt level: O0

Builder * __thiscall
capnp::anon_unknown_0::MembraneCallContextHook::getResults
          (Builder *__return_storage_ptr__,MembraneCallContextHook *this,
          Maybe<capnp::MessageSize> *sizeHint)

{
  Builder builder;
  CallContextHook *pCVar1;
  Maybe<capnp::MessageSize> local_58;
  undefined8 local_40;
  undefined8 uStack_38;
  WirePointer *local_30;
  Builder *r;
  Builder *_r273;
  Maybe<capnp::MessageSize> *sizeHint_local;
  MembraneCallContextHook *this_local;
  
  _r273 = (Builder *)sizeHint;
  sizeHint_local = (Maybe<capnp::MessageSize> *)this;
  r = kj::_::readMaybe<capnp::AnyPointer::Builder>(&this->results);
  if (r == (Builder *)0x0) {
    pCVar1 = kj::Own<capnp::CallContextHook,_std::nullptr_t>::operator->(&this->inner);
    kj::Maybe<capnp::MessageSize>::Maybe(&local_58,sizeHint);
    (*pCVar1->_vptr_CallContextHook[2])(&local_40,pCVar1,&local_58);
    builder.builder.capTable = (CapTableBuilder *)uStack_38;
    builder.builder.segment = (SegmentBuilder *)local_40;
    builder.builder.pointer = local_30;
    MembraneCapTableBuilder::imbue(__return_storage_ptr__,&this->resultsCapTable,builder);
    kj::Maybe<capnp::MessageSize>::~Maybe(&local_58);
    kj::Maybe<capnp::AnyPointer::Builder>::operator=(&this->results,__return_storage_ptr__);
  }
  else {
    (__return_storage_ptr__->builder).segment = (r->builder).segment;
    (__return_storage_ptr__->builder).capTable = (r->builder).capTable;
    (__return_storage_ptr__->builder).pointer = (r->builder).pointer;
  }
  return __return_storage_ptr__;
}

Assistant:

AnyPointer::Builder getResults(kj::Maybe<MessageSize> sizeHint) override {
    KJ_IF_SOME(r, results) {
      return r;
    } else {
      auto result = resultsCapTable.imbue(inner->getResults(sizeHint));
      results = result;
      return result;
    }